

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O2

void ClearGamefield(Gamefield *gamefield)

{
  uint uVar1;
  Pixel *pPVar2;
  long lVar3;
  size_t y;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  uVar1 = gamefield->height;
  lVar3 = 0;
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    uVar5 = (ulong)gamefield->width;
    lVar6 = lVar3 * uVar5;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      pPVar2 = gamefield->pixels;
      (&pPVar2->lastUpdatedFrameNumber)[lVar6] = '\0';
      *(undefined8 *)(&(pPVar2->color).r + lVar6) = 0x2ff000000;
      lVar6 = lVar6 + 0x14;
    }
    lVar3 = lVar3 + 0x14;
  }
  return;
}

Assistant:

void ClearGamefield(Gamefield *gamefield) {
    for (size_t y = 0; y < gamefield->height; y++) {
        for (size_t x = 0; x < gamefield->width; x++) {
            gamefield->pixels[y * gamefield->width + x].lastUpdatedFrameNumber = 0;
            gamefield->pixels[y * gamefield->width + x].pixelType = Empty;
            gamefield->pixels[y * gamefield->width + x].color.r = 0;
            gamefield->pixels[y * gamefield->width + x].color.g = 0;
            gamefield->pixels[y * gamefield->width + x].color.b = 0;
            gamefield->pixels[y * gamefield->width + x].color.a = 255;
        }
    }
}